

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExpressionConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionConstraintSyntax,slang::syntax::ExpressionConstraintSyntax_const&>
          (BumpAllocator *this,ExpressionConstraintSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  Info *pIVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  SyntaxKind SVar13;
  undefined4 uVar14;
  ExpressionConstraintSyntax *pEVar15;
  
  pEVar15 = (ExpressionConstraintSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExpressionConstraintSyntax *)this->endPtr < pEVar15 + 1) {
    pEVar15 = (ExpressionConstraintSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pEVar15 + 1);
  }
  SVar13 = (args->super_ConstraintItemSyntax).super_SyntaxNode.kind;
  uVar14 = *(undefined4 *)&(args->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConstraintItemSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConstraintItemSyntax).super_SyntaxNode.previewNode;
  TVar9 = (args->soft).kind;
  uVar10 = (args->soft).field_0x2;
  NVar11.raw = (args->soft).numFlags.raw;
  uVar12 = (args->soft).rawLen;
  pIVar3 = (args->soft).info;
  pEVar4 = (args->expr).ptr;
  uVar6 = (args->semi).field_0x2;
  NVar7.raw = (args->semi).numFlags.raw;
  uVar8 = (args->semi).rawLen;
  pIVar5 = (args->semi).info;
  (pEVar15->semi).kind = (args->semi).kind;
  (pEVar15->semi).field_0x2 = uVar6;
  (pEVar15->semi).numFlags = (NumericTokenFlags)NVar7.raw;
  (pEVar15->semi).rawLen = uVar8;
  (pEVar15->semi).info = pIVar5;
  (pEVar15->soft).info = pIVar3;
  (pEVar15->expr).ptr = pEVar4;
  (pEVar15->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pEVar15->soft).kind = TVar9;
  (pEVar15->soft).field_0x2 = uVar10;
  (pEVar15->soft).numFlags = (NumericTokenFlags)NVar11.raw;
  (pEVar15->soft).rawLen = uVar12;
  (pEVar15->super_ConstraintItemSyntax).super_SyntaxNode.kind = SVar13;
  *(undefined4 *)&(pEVar15->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4 = uVar14;
  (pEVar15->super_ConstraintItemSyntax).super_SyntaxNode.parent = pSVar1;
  return pEVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }